

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall Board::do_move(Board *this,uint turn,Point *source,Point *destination)

{
  undefined8 *puVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  uint local_1c;
  
  pvVar2 = (this->m_board).m_data.
           super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pvVar2[source->m_x].
                    super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
  ;
  lVar7 = (long)source->m_y * 0x10;
  lVar4 = *(long *)&pvVar2[destination->m_x].
                    super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
  ;
  lVar8 = (long)destination->m_y * 0x10;
  puVar1 = (undefined8 *)(lVar3 + lVar7);
  uVar5 = *puVar1;
  uVar6 = puVar1[1];
  puVar1 = (undefined8 *)(lVar3 + lVar7);
  *puVar1 = 0;
  puVar1[1] = 0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar4 + 8 + lVar8);
  puVar1 = (undefined8 *)(lVar4 + lVar8);
  *puVar1 = uVar5;
  puVar1[1] = uVar6;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_1c = turn;
  std::vector<std::pair<unsigned_int,Point>,std::allocator<std::pair<unsigned_int,Point>>>::
  emplace_back<unsigned_int&,Point_const&>
            ((vector<std::pair<unsigned_int,Point>,std::allocator<std::pair<unsigned_int,Point>>> *)
             (*(long *)(*(long *)&(this->m_board).m_data.
                                  super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[destination->m_x].
                                  super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                       + (long)destination->m_y * 0x10) + 0x10),&local_1c,destination);
  return;
}

Assistant:

void Board::do_move(unsigned int turn, const Point &source, const Point &destination) {
    m_board[destination] = move(m_board[source]);
    m_board[destination]->do_move(turn, destination);
}